

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O2

bool __thiscall
WorkQueue<CMU462::WorkItem>::try_get_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *outPtr)

{
  pointer pWVar1;
  pointer pWVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  std::mutex::lock(&this->lock);
  pWVar1 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pWVar1 != pWVar2) {
    iVar3 = pWVar1->tile_y;
    iVar4 = pWVar1->tile_w;
    iVar5 = pWVar1->tile_h;
    outPtr->tile_x = pWVar1->tile_x;
    outPtr->tile_y = iVar3;
    outPtr->tile_w = iVar4;
    outPtr->tile_h = iVar5;
    std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::erase
              (&this->storage,
               (this->storage).
               super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return pWVar1 != pWVar2;
}

Assistant:

bool try_get_work(T *outPtr) {
      lock.lock();
      if (storage.empty()) {
        lock.unlock();
        return false;
      }
      *outPtr = storage.front();
      storage.erase(storage.begin());
      lock.unlock();
      return true;
    }